

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  XmlWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pMVar2;
  pointer pcVar3;
  undefined8 this_01;
  int iVar4;
  OfType OVar5;
  undefined8 in_RCX;
  XmlFormatting fmt;
  pointer pMVar6;
  undefined8 uVar7;
  char cVar8;
  string local_b8;
  undefined4 local_94;
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  iVar4 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_94 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),1);
  if (((char)iVar4 == '\0') &&
     ((OVar5 = (assertionStats->assertionResult).m_resultData.resultType, (OVar5 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar5 != Warning) {
      return true;
    }
    local_94 = 0;
  }
  pMVar6 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  fmt = (XmlFormatting)&local_b8;
  local_50._M_allocated_capacity = (size_type)assertionStats;
  local_50._8_8_ = this;
  if (pMVar6 != pMVar2) {
    cVar8 = (char)local_94;
    do {
      if (pMVar6->type == Info && cVar8 == '\x01') {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Info","");
        XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml,fmt);
        XmlWriter::writeText((XmlWriter *)local_90._0_8_,&pMVar6->message,Newline|Indent);
LAB_00130803:
        XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      else if (pMVar6->type == Warning) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Warning","");
        XmlWriter::scopedElement((XmlWriter *)local_90,(string *)&this->m_xml,fmt);
        XmlWriter::writeText((XmlWriter *)local_90._0_8_,&pMVar6->message,Newline|Indent);
        goto LAB_00130803;
      }
      pMVar6 = pMVar6 + 1;
    } while (pMVar6 != pMVar2);
  }
  this_01 = local_50._8_8_;
  uVar7 = local_50._M_allocated_capacity;
  OVar5 = *(OfType *)(local_50._M_allocated_capacity + 0x90);
  if ((byte)((byte)local_94 | OVar5 == Warning) != 1) {
    return true;
  }
  if (*(size_type *)(local_50._M_allocated_capacity + 0x30) != 0) {
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expression","");
    this_00 = (XmlWriter *)(this_01 + 0x170);
    XmlWriter::startElement(this_00,&local_b8,Newline|Indent);
    local_90._0_8_ = (XmlWriter *)local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"success","");
    XmlWriter::writeAttribute
              (this_00,(string *)local_90,(*(undefined1 *)(uVar7 + 0x90) & FailureBit) == Ok);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 0x10),"type","");
    local_40._M_allocated_capacity =
         (size_type)
         (((AssertionResult *)(local_50._M_allocated_capacity + 8))->m_info).macroName.m_start;
    local_40._8_8_ = *(size_type *)(local_50._M_allocated_capacity + 0x10);
    XmlWriter::writeAttribute<Catch::StringRef>
              (this_00,(string *)(local_80 + 0x10),(StringRef *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_50._M_allocated_capacity;
    if ((XmlWriter *)local_90._0_8_ != (XmlWriter *)local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = ((SourceLineInfo *)(uVar7 + 0x18))->file;
    local_b8._M_string_length = *(size_t *)(uVar7 + 0x20);
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b8);
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Original","");
    XmlWriter::scopedElement((XmlWriter *)(local_80 + 0x10),(string *)this_00,fmt);
    AssertionResult::getExpression_abi_cxx11_((string *)local_90,(AssertionResult *)(uVar7 + 8));
    XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,(string *)local_90,Newline|Indent);
    if ((XmlWriter *)local_90._0_8_ != (XmlWriter *)local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_80 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Expanded","");
    XmlWriter::scopedElement((XmlWriter *)(local_80 + 0x10),(string *)this_00,fmt);
    AssertionResult::getExpandedExpression_abi_cxx11_
              ((string *)local_90,(AssertionResult *)(uVar7 + 8));
    XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,(string *)local_90,Newline|Indent);
    if ((XmlWriter *)local_90._0_8_ != (XmlWriter *)local_80) {
      operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_80 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    OVar5 = *(OfType *)(uVar7 + 0x90);
  }
  if (OVar5 < ThrewException) {
    if (OVar5 == Info) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Info","");
      XmlWriter::scopedElement((XmlWriter *)(local_80 + 0x10),(string *)(this_01 + 0x170),fmt);
      pcVar3 = (((AssertionStats *)uVar7)->assertionResult).m_resultData.message._M_dataplus._M_p;
      local_90._0_8_ = (XmlWriter *)local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,pcVar3,
                 pcVar3 + (((AssertionStats *)uVar7)->assertionResult).m_resultData.message.
                          _M_string_length);
      XmlWriter::writeText((XmlWriter *)local_70._M_dataplus._M_p,(string *)local_90,Newline|Indent)
      ;
      if ((XmlWriter *)local_90._0_8_ != (XmlWriter *)local_80) {
        operator_delete((void *)local_90._0_8_,(ulong)(local_80._0_8_ + 1));
      }
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_80 + 0x10));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00130d39;
    }
    if (OVar5 != ExplicitFailure) goto LAB_00130d39;
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Failure","");
    XmlWriter::startElement((XmlWriter *)(this_01 + 0x170),&local_b8,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (((AssertionStats *)uVar7)->assertionResult).m_info.lineInfo.file;
    local_b8._M_string_length = (((AssertionStats *)uVar7)->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b8);
    pcVar3 = (((AssertionStats *)uVar7)->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar3,
               pcVar3 + (((AssertionStats *)uVar7)->assertionResult).m_resultData.message.
                        _M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01 + 0x170),&local_b8,Newline|Indent);
  }
  else if (OVar5 == FatalErrorCondition) {
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"FatalErrorCondition","");
    XmlWriter::startElement((XmlWriter *)(this_01 + 0x170),&local_b8,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (((AssertionStats *)uVar7)->assertionResult).m_info.lineInfo.file;
    local_b8._M_string_length = (((AssertionStats *)uVar7)->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b8);
    pcVar3 = (((AssertionStats *)uVar7)->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar3,
               pcVar3 + (((AssertionStats *)uVar7)->assertionResult).m_resultData.message.
                        _M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01 + 0x170),&local_b8,Newline|Indent);
  }
  else {
    if (OVar5 != ThrewException) goto LAB_00130d39;
    paVar1 = &local_b8.field_2;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Exception","");
    XmlWriter::startElement((XmlWriter *)(this_01 + 0x170),&local_b8,Newline|Indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (((AssertionStats *)uVar7)->assertionResult).m_info.lineInfo.file;
    local_b8._M_string_length = (((AssertionStats *)uVar7)->assertionResult).m_info.lineInfo.line;
    writeSourceInfo((XmlReporter *)this_01,(SourceLineInfo *)&local_b8);
    pcVar3 = (((AssertionStats *)uVar7)->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar3,
               pcVar3 + (((AssertionStats *)uVar7)->assertionResult).m_resultData.message.
                        _M_string_length);
    XmlWriter::writeText((XmlWriter *)(this_01 + 0x170),&local_b8,Newline|Indent);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  XmlWriter::endElement((XmlWriter *)(this_01 + 0x170),Newline|Indent);
LAB_00130d39:
  if ((((AssertionStats *)uVar7)->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement((XmlWriter *)(this_01 + 0x170),Newline|Indent);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }